

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::SweepObjects<(Memory::SweepMode)0>(LargeHeapBlock *this,Recycler *recycler)

{
  size_t *psVar1;
  size_t size;
  LargeHeapBlockFreeListEntry *pLVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  LargeObjectHeader *pLVar9;
  uint uVar10;
  uint index;
  uint local_34;
  
  uVar6 = GetMarkCount(this);
  uVar10 = this->expectedSweepCount;
  if (uVar10 != this->allocCount - uVar6) {
    BVar7 = Recycler::IsConcurrentSweepState(recycler);
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x7b7,
                         "(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState())"
                         ,
                         "expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState()"
                        );
      if (!bVar4) goto LAB_006eb137;
      *puVar8 = 0;
    }
    uVar10 = this->expectedSweepCount;
  }
  if ((uVar10 == 0) && ((this->super_HeapBlock).isForceSweeping == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7bb,"(expectedSweepCount != 0 || isForceSweeping)",
                       "expectedSweepCount != 0 || isForceSweeping");
    if (!bVar4) goto LAB_006eb137;
    *puVar8 = 0;
  }
  if (this->lastCollectAllocCount == 0) {
    local_34 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_34 = 0;
    index = 0;
    do {
      psVar1 = &(recycler->collectionStats).objectSweepScanCount;
      *psVar1 = *psVar1 + ((ulong)(this->super_HeapBlock).isForceSweeping ^ 1);
      pLVar9 = GetHeaderByIndex(this,index);
      if (pLVar9 == (LargeObjectHeader *)0x0) {
        uVar10 = this->expectedSweepCount;
        if (uVar10 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x7c6,"(expectedSweepCount != 0)","expectedSweepCount != 0");
          if (!bVar4) goto LAB_006eb137;
          *puVar8 = 0;
          uVar10 = this->expectedSweepCount;
        }
        this->expectedSweepCount = uVar10 - 1;
        if ((recycler->recyclerFlagsTable->Verbose == true) &&
           ((bVar4 = Js::Phases::IsEnabled
                               (&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase), bVar4
            || (bVar4 = Js::Phases::IsEnabled
                                  (&recycler->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase),
               bVar4)))) {
          Output::Print(L"Index %d empty\n",(ulong)index);
        }
      }
      else {
        if (index != pLVar9->objectIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,1999,"(header->objectIndex == i)","header->objectIndex == i");
          if (!bVar4) goto LAB_006eb137;
          *puVar8 = 0;
        }
        bVar4 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,pLVar9 + 1);
        if (bVar4) {
          bVar5 = LargeObjectHeader::GetAttributes(pLVar9,recycler->Cookie);
          if ((bVar5 & 4) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x7d6,"((attributes & NewFinalizeBit) == 0)",
                               "(attributes & NewFinalizeBit) == 0");
            if (!bVar4) goto LAB_006eb137;
            *puVar8 = 0;
          }
          pLVar9 = GetHeaderByIndex(this,index);
          psVar1 = &(recycler->collectionStats).largeHeapBlockUsedByteCount;
          *psVar1 = *psVar1 + pLVar9->objectSize;
        }
        else {
          size = pLVar9->objectSize;
          Recycler::NotifyFree(recycler,(char *)(pLVar9 + 1),size);
          SweepObject<(Memory::SweepMode)0>(this,recycler,pLVar9);
          if ((this->bucket->supportFreeList == true) &&
             ((this->super_HeapBlock).isForceSweeping == false)) {
            pLVar2 = (this->freeList).entries;
            pLVar9->objectIndex = index;
            pLVar9->next = (LargeObjectHeader *)this;
            *(LargeHeapBlockFreeListEntry **)&pLVar9->attributesAndChecksum = pLVar2;
            pLVar9->objectSize = size;
            (this->freeList).entries = (LargeHeapBlockFreeListEntry *)pLVar9;
          }
          local_34 = local_34 + 1;
        }
      }
      index = index + 1;
    } while (index < this->lastCollectAllocCount);
  }
  if (local_34 != this->expectedSweepCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7f6,"(sweepCount == expectedSweepCount)",
                       "sweepCount == expectedSweepCount");
    if (!bVar4) {
LAB_006eb137:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  (this->super_HeapBlock).isPendingConcurrentSweep = false;
  return;
}

Assistant:

void
LargeHeapBlock::SweepObjects(Recycler * recycler)
{
#if ENABLE_CONCURRENT_GC
    Assert(mode == SweepMode_InThread || this->isPendingConcurrentSweep);
#else
    Assert(mode == SweepMode_InThread);
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
#if DBG
    uint markCount = GetMarkCount();

    // mark count included newly allocated objects
#if ENABLE_CONCURRENT_GC
    Assert(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState());
#else
    Assert(expectedSweepCount == allocCount - markCount);
#endif
    Assert(expectedSweepCount != 0 || isForceSweeping);
    uint sweepCount = 0;
#endif

    for (uint i = 0; i < lastCollectAllocCount; i++)
    {
        RECYCLER_STATS_ADD(recycler, objectSweepScanCount, !isForceSweeping);
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
#if DBG
            Assert(expectedSweepCount != 0);
            expectedSweepCount--;
#endif
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Index %d empty\n"), i);
#endif
            continue;
        }

        Assert(header->objectIndex == i);

        // Skip sweep if the object is alive
        if (heapBlockMap.IsMarked(header->GetAddress()))
        {
#if DBG
            unsigned char attributes = header->GetAttributes(recycler->Cookie);
            Assert((attributes & NewFinalizeBit) == 0);
#endif

            RECYCLER_STATS_ADD(recycler, largeHeapBlockUsedByteCount, this->GetHeaderByIndex(i)->objectSize);
            continue;
        }

        size_t objectSize = header->objectSize;
        recycler->NotifyFree((char *)header->GetAddress(), objectSize);

        SweepObject<mode>(recycler, header);

        if (this->bucket->SupportFreeList()
#ifdef RECYCLER_STATS
            && !isForceSweeping
#endif
            )
        {
            LargeHeapBlockFreeListEntry* head = this->freeList.entries;
            LargeHeapBlockFreeListEntry* entry = (LargeHeapBlockFreeListEntry*) header;
            entry->headerIndex = i;
            entry->heapBlock = this;
            entry->next = head;
            entry->objectSize = objectSize;
            this->freeList.entries = entry;
        }

#if DBG
        sweepCount++;
#endif
    }

    Assert(sweepCount == expectedSweepCount);
#if ENABLE_CONCURRENT_GC
    this->isPendingConcurrentSweep = false;
#endif
}